

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O2

bool __thiscall Debugger::Initialize(Debugger *this)

{
  JsContextRef *ppvVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  PAL_FILE *pPVar5;
  LPCWSTR pWVar6;
  char16_t *format;
  Debugger *this_00;
  JsValueRef local_80;
  JsValueRef args [1];
  JsValueRef result;
  AutoRestoreContext autoRestoreContext;
  JsValueRef scriptSource;
  JsValueRef fname;
  JsValueRef undefinedValue;
  JsValueRef globalObj;
  JsPropertyIdRef hostDebugObjectPropId;
  JsPropertyIdRef hostDebugObject;
  JsValueRef globalFunc;
  
  if (this->m_context != (JsContextRef)0x0) {
    pPVar5 = PAL_get_stderr(0);
    PAL_fprintf(pPVar5,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Debugger.cpp"
                ,0xe9,"this->m_context == JS_INVALID_REFERENCE",
                "this->m_context == JS_INVALID_REFERENCE");
    pPVar5 = PAL_get_stderr(0);
    PAL_fflush(pPVar5);
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  ppvVar1 = &this->m_context;
  JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateContext)(this->m_runtime,ppvVar1);
  if (JVar4 != JsNoError) {
    pPVar5 = PAL_get_stderr(0);
    pWVar6 = Helpers::JsErrorCodeToString(JVar4);
    format = 
    L"ERROR: ChakraRTInterface::JsCreateContext(this->m_runtime, &this->m_context) failed. JsErrorCode=0x%x (%s)\n"
    ;
LAB_0010b04c:
    PAL_fwprintf(pPVar5,format,(ulong)JVar4,pWVar6);
    pPVar5 = PAL_get_stderr(0);
    PAL_fflush(pPVar5);
    return false;
  }
  JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtAddRef)(*ppvVar1,(uint *)0x0);
  if (JVar4 != JsNoError) {
    pPVar5 = PAL_get_stderr(0);
    pWVar6 = Helpers::JsErrorCodeToString(JVar4);
    format = 
    L"ERROR: ChakraRTInterface::JsAddRef(this->m_context, nullptr) failed. JsErrorCode=0x%x (%s)\n";
    goto LAB_0010b04c;
  }
  AutoRestoreContext::AutoRestoreContext((AutoRestoreContext *)&result,*ppvVar1);
  hostDebugObject = (JsPropertyIdRef)0x0;
  JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateExternalArrayBuffer)
                    ("//-------------------------------------------------------------------------------------------------------\n// Copyright (C) Microsoft. All rights reserved.\n// Copyright (c) 2021 ChakraCore Project Contributors. All rights reserved.\n// Licensed under the MIT license. See LICENSE.txt file in the project root for full license information.\n//-------------------------------------------------------------------------------------------------------\n\nvar TRACE_NONE = 0x0000;\nvar TRACE_COMMANDS = 0x001;\nvar TRACE_DIAG_OUTPUT = 0x002;\nvar TRACE_INTERNAL_FUNCTIONS = 0x004;\nvar TRACE_DEBUG_EVENTS = 0x008;\nvar TRACE_ALL = TRACE_COMMANDS | TRACE_DIAG_OUTPUT | TRACE_INTERNAL_FUNCTIONS | TRACE_DEBUG_EVENTS;\n\n// Have all JsDiag* functions installed on it by Debugger.cpp\nvar hostDebugObject = {};\n\nvar controllerObj = (function () {\n    var _commandList = [];\n    var _commandCompletions = [];\n    var _wasResumed = false;\n    var _currentStackFrameIndex = 0;\n    var _trace = TRACE_NONE;\n    var _eventLog = [];\n    var _baseline = undefined;\n    var _exceptionCommands = undefined;\n    var _onasyncbreakCommands = undefined;\n    var _inspectMaxStringLength = 16;\n\n    function internalPrint(str) {\n        WScript.Echo(str);\n    }\n\n    function isTracing(traceFlag) {\n        return _trace & traceFlag;\n    }\n\n    function internalTrace(traceFlag, ...varArgs) {\n        if (isTracing(traceFlag)) {\n            var str = \"\";\n            varArgs.map(function (element) {\n                str += (typeof element != \"string\") ? JSON.stringify(element, undefined, \"  \") : element;\n            });\n            internalPrint(str);\n        }\n    }\n\n    function printError(str) {\n        internalPrint(\"Error: \" + str);\n    }\n\n    function callHostFunction(fn) {\n        var result = fn.apply(undefined, [].slice.call(arguments, 1));\n        var obj = {};\n        obj[fn.name] = result;\n        internalTrace(TRACE_DIAG_OUTPUT, obj);\n        return result;\n    }\n\n    filterLog = (function () {\n        var parentFilter = { \"this\": 1, \"locals\": 1, \"globals\": 1 };\n ..." /* TRUNCATED STRING LITERAL */
                     ,0x9d77,(JsFinalizeCallback)0x0,(void *)0x0,
                     (JsValueRef *)&autoRestoreContext.contextChanged);
  if (JVar4 == JsNoError) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)("DbgController.js",0x10,&scriptSource);
    JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtParse)
                      ((JsValueRef)autoRestoreContext._8_8_,0xffffffffffffffff,scriptSource,
                       JsParseScriptAttributeLibraryCode,&hostDebugObject);
    if (JVar4 == JsNoError) {
      JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&fname);
      if (JVar4 == JsNoError) {
        local_80 = fname;
        args[0] = (JsValueRef)0x0;
        JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCallFunction)
                          (hostDebugObject,&local_80,1,args);
        if (JVar4 == JsNoError) {
          undefinedValue = (JsValueRef)0x0;
          JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetGlobalObject)(&undefinedValue);
          if (JVar4 == JsNoError) {
            JVar4 = CreatePropertyIdFromString("hostDebugObject",&globalObj);
            if (JVar4 == JsNoError) {
              this_00 = (Debugger *)undefinedValue;
              JVar4 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                                (undefinedValue,globalObj,&hostDebugObjectPropId);
              if (JVar4 == JsNoError) {
                InstallDebugCallbacks(this_00,hostDebugObjectPropId);
                bVar3 = WScriptJsrt::Initialize();
                if (bVar3) {
                  if (HostConfigFlags::flags.dbgbaselineIsEnabled == true) {
                    SetBaseline(this);
                  }
                  bVar3 = true;
                  if (HostConfigFlags::flags.InspectMaxStringLengthIsEnabled == true) {
                    SetInspectMaxStringLength(this);
                  }
                  goto LAB_0010b352;
                }
              }
              else {
                pPVar5 = PAL_get_stderr(0);
                pWVar6 = Helpers::JsErrorCodeToString(JVar4);
                PAL_fwprintf(pPVar5,
                             L"ERROR: ChakraRTInterface::JsGetProperty(globalObj, hostDebugObjectPropId, &hostDebugObject) failed. JsErrorCode=0x%x (%s)\n"
                             ,(ulong)JVar4,pWVar6);
                pPVar5 = PAL_get_stderr(0);
                PAL_fflush(pPVar5);
              }
            }
            else {
              pPVar5 = PAL_get_stderr(0);
              pWVar6 = Helpers::JsErrorCodeToString(JVar4);
              PAL_fwprintf(pPVar5,
                           L"ERROR: CreatePropertyIdFromString(\"hostDebugObject\", &hostDebugObjectPropId) failed. JsErrorCode=0x%x (%s)\n"
                           ,(ulong)JVar4,pWVar6);
              pPVar5 = PAL_get_stderr(0);
              PAL_fflush(pPVar5);
            }
          }
          else {
            pPVar5 = PAL_get_stderr(0);
            pWVar6 = Helpers::JsErrorCodeToString(JVar4);
            PAL_fwprintf(pPVar5,
                         L"ERROR: ChakraRTInterface::JsGetGlobalObject(&globalObj) failed. JsErrorCode=0x%x (%s)\n"
                         ,(ulong)JVar4,pWVar6);
            pPVar5 = PAL_get_stderr(0);
            PAL_fflush(pPVar5);
          }
        }
        else {
          pPVar5 = PAL_get_stderr(0);
          pWVar6 = Helpers::JsErrorCodeToString(JVar4);
          PAL_fwprintf(pPVar5,
                       L"ERROR: ChakraRTInterface::JsCallFunction(globalFunc, args, _countof(args), &result) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar4,pWVar6);
          pPVar5 = PAL_get_stderr(0);
          PAL_fflush(pPVar5);
        }
      }
      else {
        pPVar5 = PAL_get_stderr(0);
        pWVar6 = Helpers::JsErrorCodeToString(JVar4);
        PAL_fwprintf(pPVar5,
                     L"ERROR: ChakraRTInterface::JsGetUndefinedValue(&undefinedValue) failed. JsErrorCode=0x%x (%s)\n"
                     ,(ulong)JVar4,pWVar6);
        pPVar5 = PAL_get_stderr(0);
        PAL_fflush(pPVar5);
      }
    }
    else {
      pPVar5 = PAL_get_stderr(0);
      pWVar6 = Helpers::JsErrorCodeToString(JVar4);
      PAL_fwprintf(pPVar5,
                   L"ERROR: ChakraRTInterface::JsParse(scriptSource, JS_SOURCE_CONTEXT_NONE, fname, JsParseScriptAttributeLibraryCode, &globalFunc) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar4,pWVar6);
      pPVar5 = PAL_get_stderr(0);
      PAL_fflush(pPVar5);
    }
  }
  else {
    pPVar5 = PAL_get_stderr(0);
    pWVar6 = Helpers::JsErrorCodeToString(JVar4);
    PAL_fwprintf(pPVar5,
                 L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer( (void*)controllerScript, (unsigned int)strlen(controllerScript), nullptr, nullptr, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar4,pWVar6);
    pPVar5 = PAL_get_stderr(0);
    PAL_fflush(pPVar5);
  }
  bVar3 = false;
LAB_0010b352:
  AutoRestoreContext::~AutoRestoreContext((AutoRestoreContext *)&result);
  return bVar3;
}

Assistant:

bool Debugger::Initialize()
{
    // Create a new context and run dbgcontroller.js in that context
    // setup dbgcontroller.js callbacks

    Assert(this->m_context == JS_INVALID_REFERENCE);
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCreateContext(this->m_runtime, &this->m_context));
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsAddRef(this->m_context, nullptr)); // Pin context

    AutoRestoreContext autoRestoreContext(this->m_context);

    JsValueRef globalFunc = JS_INVALID_REFERENCE;
    JsValueRef scriptSource;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCreateExternalArrayBuffer(
        (void*)controllerScript, (unsigned int)strlen(controllerScript),
        nullptr, nullptr, &scriptSource));
    JsValueRef fname;
    ChakraRTInterface::JsCreateString(
        "DbgController.js", strlen("DbgController.js"), &fname);
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsParse(scriptSource,
        JS_SOURCE_CONTEXT_NONE, fname, JsParseScriptAttributeLibraryCode,
        &globalFunc));

    JsValueRef undefinedValue;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetUndefinedValue(&undefinedValue));

    JsValueRef args[] = { undefinedValue };
    JsValueRef result = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCallFunction(globalFunc, args, _countof(args), &result));

    JsValueRef globalObj = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetGlobalObject(&globalObj));

    JsPropertyIdRef hostDebugObjectPropId;
    IfJsrtErrorFailLogAndRetFalse(CreatePropertyIdFromString("hostDebugObject", &hostDebugObjectPropId));

    JsPropertyIdRef hostDebugObject;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetProperty(globalObj, hostDebugObjectPropId, &hostDebugObject));

    this->InstallDebugCallbacks(hostDebugObject);

    if (!WScriptJsrt::Initialize())
    {
        return false;
    }

    if (HostConfigFlags::flags.dbgbaselineIsEnabled)
    {
        this->SetBaseline();
    }

    if (HostConfigFlags::flags.InspectMaxStringLengthIsEnabled)
    {
        this->SetInspectMaxStringLength();
    }

    return true;
}